

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Error doCdataSection(XML_Parser parser,ENCODING *enc,char **startPtr,char *end,char **nextPtr)

{
  int iVar1;
  XML_Error XVar2;
  code *pcVar3;
  undefined8 *puVar4;
  char **ppcVar5;
  undefined8 uVar6;
  undefined8 *puVar7;
  char *s;
  char *next;
  ICHAR *dataPtr;
  char **local_48;
  char **local_40;
  char *local_38;
  
  s = *startPtr;
  if (*(ENCODING **)((long)parser + 0x118) == enc) {
    puVar4 = (undefined8 *)((long)parser + 0x218);
    *(char **)((long)parser + 0x218) = s;
    puVar7 = (undefined8 *)((long)parser + 0x220);
  }
  else {
    puVar4 = *(undefined8 **)((long)parser + 0x230);
    puVar7 = puVar4 + 1;
  }
  *puVar4 = s;
  *startPtr = (char *)0x0;
  local_48 = nextPtr;
  local_40 = startPtr;
  local_38 = end;
  do {
    iVar1 = (*enc->scanners[2])(enc,s,local_38,&next);
    *puVar7 = next;
    switch(iVar1) {
    case 0:
      *puVar4 = next;
      return XML_ERROR_INVALID_TOKEN;
    case 6:
      pcVar3 = *(code **)((long)parser + 0x78);
      if (pcVar3 == (code *)0x0) {
LAB_0046e565:
        if (*(long *)((long)parser + 0xa0) != 0) {
          reportDefault(parser,enc,s,next);
        }
      }
      else {
        if (enc->isUtf8 != '\0') {
          uVar6 = *(undefined8 *)((long)parser + 8);
          iVar1 = (int)next - (int)s;
          ppcVar5 = (char **)s;
          goto LAB_0046e561;
        }
        while( true ) {
          dataPtr = *(ICHAR **)((long)parser + 0x58);
          (*enc->utf8Convert)(enc,&s,next,&dataPtr,*(char **)((long)parser + 0x60));
          *puVar7 = next;
          (**(code **)((long)parser + 0x78))
                    (*(undefined8 *)((long)parser + 8),*(undefined8 *)((long)parser + 0x58),
                     (int)dataPtr - (int)*(undefined8 *)((long)parser + 0x58));
          if (s == next) break;
          *puVar4 = s;
        }
      }
      break;
    case 7:
      pcVar3 = *(code **)((long)parser + 0x78);
      if (pcVar3 == (code *)0x0) goto LAB_0046e565;
      dataPtr = (ICHAR *)CONCAT71(dataPtr._1_7_,10);
      uVar6 = *(undefined8 *)((long)parser + 8);
      iVar1 = 1;
      ppcVar5 = &dataPtr;
LAB_0046e561:
      (*pcVar3)(uVar6,ppcVar5,iVar1);
      break;
    case -4:
    case -1:
      next = s;
      local_40 = local_48;
      if (local_48 == (char **)0x0) {
        XVar2 = XML_ERROR_UNCLOSED_CDATA_SECTION;
      }
      else {
LAB_0046e603:
        *local_40 = next;
        XVar2 = XML_ERROR_NONE;
      }
      return XVar2;
    case -3:
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
      goto switchD_0046e4d4_caseD_fffffffd;
    case -2:
      next = s;
      local_40 = local_48;
      if (local_48 == (char **)0x0) {
        return XML_ERROR_PARTIAL_CHAR;
      }
      goto LAB_0046e603;
    default:
      if (iVar1 != 0x28) {
switchD_0046e4d4_caseD_fffffffd:
        *puVar4 = next;
        return XML_ERROR_UNEXPECTED_STATE;
      }
      if (*(code **)((long)parser + 0x98) == (code *)0x0) {
        if (*(long *)((long)parser + 0xa0) != 0) {
          reportDefault(parser,enc,s,next);
        }
      }
      else {
        (**(code **)((long)parser + 0x98))(*(undefined8 *)((long)parser + 8));
      }
      goto LAB_0046e603;
    }
    s = next;
    *puVar4 = next;
  } while( true );
}

Assistant:

static
enum XML_Error doCdataSection(XML_Parser parser,
                              const ENCODING *enc,
                              const char **startPtr,
                              const char *end,
                              const char **nextPtr)
{
  const char *s = *startPtr;
  const char **eventPP;
  const char **eventEndPP;
  if (enc == encoding) {
    eventPP = &eventPtr;
    *eventPP = s;
    eventEndPP = &eventEndPtr;
  }
  else {
    eventPP = &(openInternalEntities->internalEventPtr);
    eventEndPP = &(openInternalEntities->internalEventEndPtr);
  }
  *eventPP = s;
  *startPtr = 0;
  for (;;) {
    const char *next;
    int tok = XmlCdataSectionTok(enc, s, end, &next);
    *eventEndPP = next;
    switch (tok) {
    case XML_TOK_CDATA_SECT_CLOSE:
      if (endCdataSectionHandler)
        endCdataSectionHandler(handlerArg);
#if 0
      /* see comment under XML_TOK_CDATA_SECT_OPEN */
      else if (characterDataHandler)
        characterDataHandler(handlerArg, dataBuf, 0);
#endif
      else if (defaultHandler)
        reportDefault(parser, enc, s, next);
      *startPtr = next;
      return XML_ERROR_NONE;
    case XML_TOK_DATA_NEWLINE:
      if (characterDataHandler) {
        XML_Char c = 0xA;
        characterDataHandler(handlerArg, &c, 1);
      }
      else if (defaultHandler)
        reportDefault(parser, enc, s, next);
      break;
    case XML_TOK_DATA_CHARS:
      if (characterDataHandler) {
        if (MUST_CONVERT(enc, s)) {
          for (;;) {
            ICHAR *dataPtr = (ICHAR *)dataBuf;
            XmlConvert(enc, &s, next, &dataPtr, (ICHAR *)dataBufEnd);
            *eventEndPP = next;
            characterDataHandler(handlerArg, dataBuf, dataPtr - (ICHAR *)dataBuf);
            if (s == next)
              break;
            *eventPP = s;
          }
        }
        else
          characterDataHandler(handlerArg,
                               (XML_Char *)s,
                               (XML_Char *)next - (XML_Char *)s);
      }
      else if (defaultHandler)
        reportDefault(parser, enc, s, next);
      break;
    case XML_TOK_INVALID:
      *eventPP = next;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_PARTIAL_CHAR:
      if (nextPtr) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_PARTIAL_CHAR;
    case XML_TOK_PARTIAL:
    case XML_TOK_NONE:
      if (nextPtr) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_UNCLOSED_CDATA_SECTION;
    default:
      *eventPP = next;
      return XML_ERROR_UNEXPECTED_STATE;
    }
    *eventPP = s = next;
  }
  /* not reached */
}